

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fts3SegmentMerge(Fts3Table *p,int iLangid,int iIndex,int iLevel)

{
  byte bVar1;
  char *pcVar2;
  Fts3SegReader **ppFVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uchar *q;
  Mem *pMVar7;
  i64 iVar8;
  i64 iVar9;
  SegmentNode **ppTree;
  SegmentNode *pSVar10;
  SegmentNode *pSVar11;
  byte *pbVar12;
  SegmentNode *pSVar13;
  ulong uVar14;
  SegmentNode *pSVar15;
  byte *pbVar16;
  long lVar17;
  int iVar18;
  SegmentNode *pSVar19;
  int iVar20;
  ulong uVar21;
  SegmentNode *pSVar22;
  undefined4 uVar23;
  undefined8 uVar24;
  u64 uVar25;
  ulong uVar26;
  uint uVar27;
  int iVar28;
  size_t sVar29;
  undefined1 *iEndBlock;
  uint uVar30;
  ulong uVar31;
  SegmentNode *iBlock;
  uint uVar32;
  byte *pbVar33;
  SegmentNode *pSVar34;
  char cVar35;
  uint uVar36;
  long lVar37;
  sqlite3_stmt *psVar38;
  bool bVar39;
  sqlite3_stmt *local_f8;
  i64 local_f0;
  i64 local_e8;
  ulong local_e0;
  ulong local_d8;
  char *local_d0;
  undefined4 local_c4;
  i64 local_c0;
  ulong local_b8;
  char *local_b0;
  Fts3SegFilter local_a8;
  Fts3MultiSegReader csr;
  
  csr.nTerm = 0;
  csr._68_4_ = 0;
  csr.aDoclist = (char *)0x0;
  csr.bLookup = 0;
  csr._52_4_ = 0;
  csr.zTerm = (char *)0x0;
  csr.nBuffer = 0;
  csr.iColFilter = 0;
  csr.bRestart = 0;
  csr.nCost = 0;
  csr.pFilter = (Fts3SegFilter *)0x0;
  csr.aBuffer = (char *)0x0;
  csr.apSegment = (Fts3SegReader **)0x0;
  csr.nSegment = 0;
  csr.nAdvance = 0;
  csr.nDoclist = 0;
  csr._84_4_ = 0;
  iVar4 = fts3SegReaderCursor(p,iLangid,iIndex,iLevel,(char *)0x0,0,1,0,&csr);
  iVar6 = csr.nSegment;
  if (csr.nSegment == 0 || iVar4 != 0) goto LAB_001d692c;
  if (iLevel == -1) {
    local_f0 = 0;
    iVar8 = local_f0;
LAB_001d6739:
    local_f0 = iVar8;
    iVar6 = p->nIndex;
    iVar4 = fts3SqlStmt(p,8,(sqlite3_stmt **)&local_a8,(sqlite3_value **)0x0);
    pcVar2 = local_a8.zTerm;
    if (iVar4 != 0) goto LAB_001d692c;
    lVar17 = (long)iLevel + ((long)iVar6 * (long)iLangid + (long)iIndex) * 0x400 + 1;
    lVar37 = (long)iLevel + 1;
    sqlite3_bind_int64((sqlite3_stmt *)local_a8.zTerm,1,
                       ((long)p->nIndex * (long)iLangid + (long)iIndex) * 0x400 + lVar37);
    iVar6 = sqlite3_step((sqlite3_stmt *)pcVar2);
    if (iVar6 == 100) {
      pMVar7 = columnMem((sqlite3_stmt *)pcVar2,0);
      iVar9 = sqlite3VdbeIntValue(pMVar7);
      columnMallocFailure((sqlite3_stmt *)pcVar2);
      iVar4 = sqlite3_reset((sqlite3_stmt *)pcVar2);
      if (iVar4 != 0) goto LAB_001d692c;
      if ((int)iVar9 < 0x10) goto LAB_001d68a3;
      iVar4 = fts3SegmentMerge(p,iLangid,iIndex,(int)lVar37);
      if (iVar4 != 0) goto LAB_001d692c;
      bVar39 = iLevel != -1 && local_f0 < lVar17;
      iVar9 = 0;
      iVar8 = local_f0;
    }
    else {
      iVar4 = sqlite3_reset((sqlite3_stmt *)pcVar2);
      if (iVar4 != 0) goto LAB_001d692c;
      iVar9 = 0;
LAB_001d68a3:
      bVar39 = local_f0 < lVar17 && iLevel != -1;
      iVar8 = local_f0;
    }
    uVar30 = (uint)bVar39 * 2 + 1;
    uVar23 = 0;
  }
  else {
    iVar4 = fts3SqlStmt(p,0xf,(sqlite3_stmt **)&local_a8,(sqlite3_value **)0x0);
    pcVar2 = local_a8.zTerm;
    if (iVar4 != 0) goto LAB_001d692c;
    sqlite3_bind_int64((sqlite3_stmt *)local_a8.zTerm,1,
                       ((long)p->nIndex * (long)iLangid + (long)iIndex) * 0x400);
    uVar24 = 0;
    sqlite3_bind_int64((sqlite3_stmt *)pcVar2,2,
                       ((long)p->nIndex * (long)iLangid + (long)iIndex) * 0x400 | 0x3ff);
    iVar4 = sqlite3_step((sqlite3_stmt *)pcVar2);
    if (iVar4 == 100) {
      uVar24 = 0;
      pMVar7 = columnMem((sqlite3_stmt *)pcVar2,0);
      iVar8 = sqlite3VdbeIntValue(pMVar7);
      columnMallocFailure((sqlite3_stmt *)pcVar2);
    }
    else {
      iVar8 = 0;
    }
    iVar4 = sqlite3_reset((sqlite3_stmt *)pcVar2);
    if (iVar4 != 0) goto LAB_001d692c;
    if (iLevel != -2) goto LAB_001d6739;
    uVar23 = (undefined4)CONCAT71((int7)((ulong)uVar24 >> 8),1);
    iVar9 = 0;
    uVar30 = 3;
    lVar17 = iVar8;
    if ((iVar6 == 1) && ((*csr.apSegment)->ppNextElem == (Fts3HashElem **)0x0)) {
      iVar4 = 0x65;
      goto LAB_001d692c;
    }
  }
  csr.pFilter = &local_a8;
  local_a8.zTerm = (char *)0x0;
  local_a8.nTerm = 0;
  local_a8.iCol = 0;
  local_a8._20_4_ = 0;
  local_a8.flags = uVar30;
  local_f0 = iVar8;
  local_e8 = lVar17;
  local_c4 = uVar23;
  iVar4 = fts3SegReaderStart(p,&csr,(char *)0x0,0);
  if (iVar4 != 0) goto LAB_001d692c;
  ppTree = (SegmentNode **)0x0;
  local_c0 = iVar9;
  while (iVar4 = sqlite3Fts3SegReaderStep(p,&csr), pcVar2 = csr.zTerm, ppFVar3 = csr.apSegment,
        iVar4 == 100) {
    iVar6 = csr.nTerm;
    uVar31 = csr._64_8_ & 0xffffffff;
    local_b0 = csr.aDoclist;
    local_e0 = (ulong)csr.nDoclist;
    if (ppTree == (SegmentNode **)0x0) {
      iVar5 = sqlite3_initialize();
      iVar4 = 7;
      if ((iVar5 != 0) ||
         (ppTree = (SegmentNode **)sqlite3Malloc(0x48), ppTree == (SegmentNode **)0x0)) {
        ppTree = (SegmentNode **)0x0;
        goto LAB_001d6fd1;
      }
      ppTree[6] = (SegmentNode *)0x0;
      ppTree[7] = (SegmentNode *)0x0;
      ppTree[4] = (SegmentNode *)0x0;
      ppTree[5] = (SegmentNode *)0x0;
      ppTree[2] = (SegmentNode *)0x0;
      ppTree[3] = (SegmentNode *)0x0;
      *ppTree = (SegmentNode *)0x0;
      ppTree[1] = (SegmentNode *)0x0;
      ppTree[8] = (SegmentNode *)0x0;
      pSVar10 = (SegmentNode *)sqlite3_malloc(p->nNodeSize);
      ppTree[7] = pSVar10;
      if (pSVar10 == (SegmentNode *)0x0) goto LAB_001d6fd1;
      *(int *)(ppTree + 6) = p->nNodeSize;
      iVar4 = fts3SqlStmt(p,10,&local_f8,(sqlite3_value **)0x0);
      psVar38 = local_f8;
      if (iVar4 != 0) goto LAB_001d6fd1;
      iVar4 = sqlite3_step(local_f8);
      if (iVar4 == 100) {
        pMVar7 = columnMem(psVar38,0);
        pSVar10 = (SegmentNode *)sqlite3VdbeIntValue(pMVar7);
        columnMallocFailure(psVar38);
        ppTree[2] = pSVar10;
        ppTree[1] = pSVar10;
      }
      iVar4 = sqlite3_reset(psVar38);
      if (iVar4 != 0) goto LAB_001d71e1;
    }
    uVar30 = *(uint *)(ppTree + 4);
    if ((int)uVar30 < 1) {
      uVar21 = 0;
    }
    else {
      uVar21 = 0;
      do {
        if (*(char *)((long)&ppTree[3]->pParent + uVar21) != pcVar2[uVar21]) goto LAB_001d6ab4;
        uVar21 = uVar21 + 1;
      } while (uVar30 != uVar21);
      uVar21 = (ulong)uVar30;
    }
LAB_001d6ab4:
    iVar5 = (int)uVar21;
    uVar30 = iVar6 - iVar5;
    uVar21 = (ulong)uVar30;
    if (uVar30 == 0 || iVar6 < iVar5) {
      iVar4 = 0x10b;
      goto LAB_001d6fd1;
    }
    local_d0 = pcVar2;
    local_b8 = (ulong)iVar6;
    iVar18 = *(int *)((long)ppTree + 0x34);
    uVar32 = iVar6 + (int)local_e0 + 2;
    uVar14 = (long)iVar5;
    iVar6 = (iVar18 + iVar6 + (int)local_e0 + 2) - iVar5;
    uVar36 = uVar32 - iVar5;
    do {
      uVar27 = uVar36;
      iVar4 = iVar6;
      uVar26 = uVar14 >> 7;
      bVar39 = 0x7f < uVar14;
      uVar14 = uVar26;
      iVar6 = iVar4 + 1;
      uVar36 = uVar27 + 1;
    } while (bVar39);
    do {
      uVar36 = uVar27;
      iVar6 = iVar4;
      bVar39 = 0x7f < uVar21;
      uVar14 = local_e0;
      uVar21 = uVar21 >> 7;
      iVar4 = iVar6 + 1;
      uVar27 = uVar36 + 1;
    } while (bVar39);
    do {
      iVar6 = iVar6 + 1;
      uVar36 = uVar36 + 1;
      bVar39 = 0x7f < uVar14;
      uVar14 = uVar14 >> 7;
    } while (bVar39);
    local_d8 = uVar31;
    if ((0 < iVar18) && (p->nNodeSize < iVar6)) {
      pSVar10 = ppTree[2];
      ppTree[2] = (SegmentNode *)((long)&pSVar10->pParent + 1);
      iVar4 = fts3WriteSegment(p,(sqlite3_int64)pSVar10,(char *)ppTree[7],iVar18);
      if (iVar4 != 0) goto LAB_001d71e1;
      p->nLeafAdd = p->nLeafAdd + 1;
      iVar4 = fts3NodeAddTerm(p,ppTree,(int)local_d0,(char *)(ulong)(iVar5 + 1),(int)uVar26);
      if (iVar4 != 0) goto LAB_001d71e1;
      *(undefined4 *)(ppTree + 4) = 0;
      uVar31 = local_b8;
      do {
        uVar36 = uVar32;
        bVar39 = 0x7f < uVar31;
        uVar21 = local_e0;
        uVar31 = uVar31 >> 7;
        uVar32 = uVar36 + 1;
      } while (bVar39);
      do {
        uVar36 = uVar36 + 1;
        bVar39 = 0x7f < uVar21;
        uVar21 = uVar21 >> 7;
      } while (bVar39);
      iVar18 = 0;
      uVar30 = (uint)local_d8;
      iVar5 = 0;
    }
    iVar6 = (int)local_e0;
    ppTree[8] = (SegmentNode *)((long)&ppTree[8]->pParent + (long)(int)uVar36);
    pSVar10 = ppTree[7];
    if (*(int *)(ppTree + 6) < (int)uVar36) {
      iVar6 = sqlite3_initialize();
      iVar4 = 7;
      if (iVar6 != 0) goto LAB_001d71e1;
      uVar25 = 0;
      if (0 < (int)uVar36) {
        uVar25 = (u64)uVar36;
      }
      pSVar10 = (SegmentNode *)sqlite3Realloc(pSVar10,uVar25);
      if (pSVar10 == (SegmentNode *)0x0) goto LAB_001d71e1;
      ppTree[7] = pSVar10;
      *(uint *)(ppTree + 6) = uVar36;
      iVar6 = (int)local_e0;
    }
    pbVar33 = (byte *)((long)&pSVar10->pParent + (long)iVar18);
    pbVar12 = pbVar33;
    uVar31 = (long)iVar5;
    iVar4 = uVar30 + iVar18 + 2;
    iVar6 = iVar6 + uVar30 + iVar18 + 2;
    do {
      iVar20 = iVar6;
      iVar28 = iVar4;
      pbVar16 = pbVar12;
      bVar1 = (byte)uVar31;
      *pbVar16 = bVar1 | 0x80;
      bVar39 = 0x7f < uVar31;
      pbVar12 = pbVar16 + 1;
      uVar31 = uVar31 >> 7;
      iVar4 = iVar28 + 1;
      iVar6 = iVar20 + 1;
    } while (bVar39);
    *pbVar16 = bVar1;
    iVar18 = iVar18 + ((int)(pbVar16 + 1) - (int)pbVar33);
    pbVar33 = (byte *)((long)&ppTree[7]->pParent + (long)iVar18);
    pbVar12 = pbVar33;
    sVar29 = (long)(int)uVar30;
    do {
      iVar4 = iVar28;
      iVar6 = iVar20;
      pbVar16 = pbVar12;
      bVar1 = (byte)sVar29;
      *pbVar16 = bVar1 | 0x80;
      bVar39 = 0x7f < sVar29;
      pbVar12 = pbVar16 + 1;
      sVar29 = sVar29 >> 7;
      iVar20 = iVar6 + 1;
      iVar28 = iVar4 + 1;
    } while (bVar39);
    *pbVar16 = bVar1;
    iVar18 = iVar18 + ((int)(pbVar16 + 1) - (int)pbVar33);
    memcpy((void *)((long)&ppTree[7]->pParent + (long)iVar18),local_d0 + iVar5,(long)(int)uVar30);
    pbVar12 = (byte *)((long)&ppTree[7]->pParent + (long)(int)(iVar18 + uVar30));
    uVar31 = local_e0;
    do {
      pbVar33 = pbVar12;
      bVar1 = (byte)uVar31;
      *pbVar33 = bVar1 | 0x80;
      iVar6 = iVar6 + 1;
      iVar4 = iVar4 + 1;
      bVar39 = 0x7f < uVar31;
      pbVar12 = pbVar33 + 1;
      uVar31 = uVar31 >> 7;
    } while (bVar39);
    *pbVar33 = bVar1;
    memcpy((void *)((long)&ppTree[7]->pParent + (long)iVar4),local_b0,local_e0);
    *(int *)((long)ppTree + 0x34) = iVar6;
    iVar6 = (int)local_d8;
    if (*(int *)((long)ppTree + 0x24) < iVar6) {
      pSVar10 = ppTree[5];
      iVar6 = sqlite3_initialize();
      iVar4 = 7;
      if (iVar6 != 0) goto LAB_001d71e1;
      uVar30 = (int)local_d8 * 2;
      uVar25 = 0;
      if (0 < (int)uVar30) {
        uVar25 = (u64)uVar30;
      }
      pSVar10 = (SegmentNode *)sqlite3Realloc(pSVar10,uVar25);
      if (pSVar10 == (SegmentNode *)0x0) goto LAB_001d71e1;
      *(uint *)((long)ppTree + 0x24) = uVar30;
      ppTree[5] = pSVar10;
      ppTree[3] = pSVar10;
      iVar6 = (int)local_d8;
    }
    else {
      pSVar10 = ppTree[3];
    }
    memcpy(pSVar10,local_d0,local_b8);
    *(int *)(ppTree + 4) = iVar6;
  }
  if (iVar4 != 0) goto LAB_001d6fd1;
  if (iLevel == -1) {
    if (ppTree == (SegmentNode **)0x0) {
      iVar4 = 0;
      goto LAB_001d692c;
    }
LAB_001d6f9d:
    if (*ppTree == (SegmentNode *)0x0) {
      iVar6 = *(int *)((long)ppTree + 0x34);
      iVar4 = (int)local_c0;
      pSVar15 = (SegmentNode *)0x0;
      pSVar10 = (SegmentNode *)0x0;
      iEndBlock = (undefined1 *)0x0;
      pSVar13 = ppTree[7];
    }
    else {
      pSVar10 = ppTree[2];
      ppTree[2] = (SegmentNode *)((long)&pSVar10->pParent + 1);
      iVar4 = fts3WriteSegment(p,(sqlite3_int64)pSVar10,(char *)ppTree[7],
                               *(int *)((long)ppTree + 0x34));
      if (iVar4 != 0) {
LAB_001d6fce:
        p->nLeafAdd = p->nLeafAdd + 1;
        goto LAB_001d6fd1;
      }
      pSVar13 = *ppTree;
      pSVar15 = ppTree[1];
      iBlock = ppTree[2];
      pSVar11 = pSVar13->pParent;
      if (pSVar11 == (SegmentNode *)0x0) {
        cVar35 = '\x01';
      }
      else {
        cVar35 = '\x01';
        pSVar19 = pSVar13;
        pSVar22 = pSVar15;
        do {
          pSVar15 = iBlock;
          pSVar34 = pSVar19->pLeftmost;
          pSVar13 = pSVar11;
          iBlock = pSVar15;
          if (pSVar34 != (SegmentNode *)0x0) {
            do {
              lVar17 = 10;
              pSVar13 = pSVar22;
              do {
                lVar17 = lVar17 + -1;
                bVar39 = (SegmentNode *)0x7f < pSVar13;
                pSVar13 = (SegmentNode *)((ulong)pSVar13 >> 7);
              } while (bVar39);
              pSVar34->aData[lVar17] = cVar35;
              pbVar12 = (byte *)(pSVar34->aData + lVar17);
              pSVar13 = pSVar22;
              do {
                pbVar12 = pbVar12 + 1;
                bVar1 = (byte)pSVar13;
                *pbVar12 = bVar1 | 0x80;
                bVar39 = (SegmentNode *)0x7f < pSVar13;
                pSVar13 = (SegmentNode *)((ulong)pSVar13 >> 7);
              } while (bVar39);
              *pbVar12 = bVar1;
              iVar4 = fts3WriteSegment(p,(sqlite3_int64)iBlock,pSVar34->aData + lVar17,
                                       pSVar34->nData - (int)lVar17);
              iBlock = (SegmentNode *)((long)&iBlock->pParent + 1);
            } while ((pSVar34->pRight != (SegmentNode *)0x0) &&
                    (pSVar22 = (SegmentNode *)((long)&pSVar22->pParent + (long)pSVar34->nEntry + 1),
                    pSVar34 = pSVar34->pRight, iVar4 == 0));
            if (iVar4 != 0) goto LAB_001d6fce;
            pSVar13 = pSVar19->pParent;
          }
          cVar35 = cVar35 + '\x01';
          pSVar11 = pSVar13->pParent;
          pSVar19 = pSVar13;
          pSVar22 = pSVar15;
        } while (pSVar11 != (SegmentNode *)0x0);
      }
      lVar17 = 10;
      pSVar11 = pSVar15;
      do {
        lVar17 = lVar17 + -1;
        bVar39 = (SegmentNode *)0x7f < pSVar11;
        pSVar11 = (SegmentNode *)((ulong)pSVar11 >> 7);
      } while (bVar39);
      pSVar13->aData[lVar17] = cVar35;
      pbVar12 = (byte *)(pSVar13->aData + lVar17);
      do {
        pbVar12 = pbVar12 + 1;
        bVar1 = (byte)pSVar15;
        *pbVar12 = bVar1 | 0x80;
        bVar39 = (SegmentNode *)0x7f < pSVar15;
        pSVar15 = (SegmentNode *)((ulong)pSVar15 >> 7);
      } while (bVar39);
      *pbVar12 = bVar1;
      iEndBlock = (undefined1 *)((long)&iBlock[-1].aData + 7);
      iVar6 = pSVar13->nData - (int)lVar17;
      pSVar13 = (SegmentNode *)(pSVar13->aData + lVar17);
      pSVar15 = ppTree[1];
      iVar4 = (int)local_c0;
    }
    iVar4 = fts3WriteSegdir(p,local_e8,iVar4,(sqlite3_int64)pSVar15,(sqlite3_int64)pSVar10,
                            (sqlite3_int64)iEndBlock,(sqlite3_int64)ppTree[8],(char *)pSVar13,iVar6)
    ;
    p->nLeafAdd = p->nLeafAdd + 1;
    if ((iVar4 == 0) && ((iLevel == -1 || (iVar4 = 0, local_e8 < local_f0)))) {
      iVar4 = fts3PromoteSegments(p,local_e8,(sqlite3_int64)ppTree[8]);
    }
  }
  else {
    uVar31 = (ulong)csr.nSegment;
    local_f8 = (sqlite3_stmt *)0x0;
    if (0 < (long)uVar31) {
      uVar21 = 1;
      do {
        iVar4 = fts3DeleteSegment(p,ppFVar3[uVar21 - 1]);
        if (iVar4 != 0) break;
        bVar39 = uVar21 < uVar31;
        uVar21 = uVar21 + 1;
      } while (bVar39);
      if (iVar4 != 0) goto LAB_001d6fd1;
    }
    if ((char)local_c4 == '\0') {
      iVar4 = fts3SqlStmt(p,0x10,&local_f8,(sqlite3_value **)0x0);
      psVar38 = local_f8;
      if (iVar4 == 0) {
        sqlite3_bind_int64(local_f8,1,
                           (long)iLevel + ((long)iIndex + (long)iLangid * (long)p->nIndex) * 0x400);
        goto LAB_001d6f78;
      }
    }
    else {
      iVar4 = fts3SqlStmt(p,0x1a,&local_f8,(sqlite3_value **)0x0);
      psVar38 = local_f8;
      if (iVar4 == 0) {
        sqlite3_bind_int64(local_f8,1,((long)p->nIndex * (long)iLangid + (long)iIndex) * 0x400);
        sqlite3_bind_int64(psVar38,2,
                           ((long)p->nIndex * (long)iLangid + (long)iIndex) * 0x400 | 0x3ff);
LAB_001d6f78:
        sqlite3_step(psVar38);
        iVar4 = sqlite3_reset(psVar38);
        if (iVar4 == 0 && ppTree != (SegmentNode **)0x0) goto LAB_001d6f9d;
      }
    }
LAB_001d6fd1:
    if (ppTree == (SegmentNode **)0x0) goto LAB_001d692c;
  }
LAB_001d71e1:
  sqlite3_free(ppTree[7]);
  sqlite3_free(ppTree[5]);
  fts3NodeFree(*ppTree);
  sqlite3_free(ppTree);
LAB_001d692c:
  sqlite3Fts3SegReaderFinish(&csr);
  return iVar4;
}

Assistant:

static int fts3SegmentMerge(
  Fts3Table *p, 
  int iLangid,                    /* Language id to merge */
  int iIndex,                     /* Index in p->aIndex[] to merge */
  int iLevel                      /* Level to merge */
){
  int rc;                         /* Return code */
  int iIdx = 0;                   /* Index of new segment */
  sqlite3_int64 iNewLevel = 0;    /* Level/index to create new segment at */
  SegmentWriter *pWriter = 0;     /* Used to write the new, merged, segment */
  Fts3SegFilter filter;           /* Segment term filter condition */
  Fts3MultiSegReader csr;         /* Cursor to iterate through level(s) */
  int bIgnoreEmpty = 0;           /* True to ignore empty segments */
  i64 iMaxLevel = 0;              /* Max level number for this index/langid */

  assert( iLevel==FTS3_SEGCURSOR_ALL
       || iLevel==FTS3_SEGCURSOR_PENDING
       || iLevel>=0
  );
  assert( iLevel<FTS3_SEGDIR_MAXLEVEL );
  assert( iIndex>=0 && iIndex<p->nIndex );

  rc = sqlite3Fts3SegReaderCursor(p, iLangid, iIndex, iLevel, 0, 0, 1, 0, &csr);
  if( rc!=SQLITE_OK || csr.nSegment==0 ) goto finished;

  if( iLevel!=FTS3_SEGCURSOR_PENDING ){
    rc = fts3SegmentMaxLevel(p, iLangid, iIndex, &iMaxLevel);
    if( rc!=SQLITE_OK ) goto finished;
  }

  if( iLevel==FTS3_SEGCURSOR_ALL ){
    /* This call is to merge all segments in the database to a single
    ** segment. The level of the new segment is equal to the numerically
    ** greatest segment level currently present in the database for this
    ** index. The idx of the new segment is always 0.  */
    if( csr.nSegment==1 && 0==fts3SegReaderIsPending(csr.apSegment[0]) ){
      rc = SQLITE_DONE;
      goto finished;
    }
    iNewLevel = iMaxLevel;
    bIgnoreEmpty = 1;

  }else{
    /* This call is to merge all segments at level iLevel. find the next
    ** available segment index at level iLevel+1. The call to
    ** fts3AllocateSegdirIdx() will merge the segments at level iLevel+1 to 
    ** a single iLevel+2 segment if necessary.  */
    assert( FTS3_SEGCURSOR_PENDING==-1 );
    iNewLevel = getAbsoluteLevel(p, iLangid, iIndex, iLevel+1);
    rc = fts3AllocateSegdirIdx(p, iLangid, iIndex, iLevel+1, &iIdx);
    bIgnoreEmpty = (iLevel!=FTS3_SEGCURSOR_PENDING) && (iNewLevel>iMaxLevel);
  }
  if( rc!=SQLITE_OK ) goto finished;

  assert( csr.nSegment>0 );
  assert_fts3_nc( iNewLevel>=getAbsoluteLevel(p, iLangid, iIndex, 0) );
  assert_fts3_nc( 
    iNewLevel<getAbsoluteLevel(p, iLangid, iIndex,FTS3_SEGDIR_MAXLEVEL) 
  );

  memset(&filter, 0, sizeof(Fts3SegFilter));
  filter.flags = FTS3_SEGMENT_REQUIRE_POS;
  filter.flags |= (bIgnoreEmpty ? FTS3_SEGMENT_IGNORE_EMPTY : 0);

  rc = sqlite3Fts3SegReaderStart(p, &csr, &filter);
  while( SQLITE_OK==rc ){
    rc = sqlite3Fts3SegReaderStep(p, &csr);
    if( rc!=SQLITE_ROW ) break;
    rc = fts3SegWriterAdd(p, &pWriter, 1, 
        csr.zTerm, csr.nTerm, csr.aDoclist, csr.nDoclist);
  }
  if( rc!=SQLITE_OK ) goto finished;
  assert( pWriter || bIgnoreEmpty );

  if( iLevel!=FTS3_SEGCURSOR_PENDING ){
    rc = fts3DeleteSegdir(
        p, iLangid, iIndex, iLevel, csr.apSegment, csr.nSegment
    );
    if( rc!=SQLITE_OK ) goto finished;
  }
  if( pWriter ){
    rc = fts3SegWriterFlush(p, pWriter, iNewLevel, iIdx);
    if( rc==SQLITE_OK ){
      if( iLevel==FTS3_SEGCURSOR_PENDING || iNewLevel<iMaxLevel ){
        rc = fts3PromoteSegments(p, iNewLevel, pWriter->nLeafData);
      }
    }
  }

 finished:
  fts3SegWriterFree(pWriter);
  sqlite3Fts3SegReaderFinish(&csr);
  return rc;
}